

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

void AdjustMeshPeriodicTextureCoordinatesHelper
               (ON_Mesh *mesh,ON_Xform *mesh_xform,float *mesh_T,int mesh_T_stride,int *Tsd,
               double two_pi_tc,ON_TextureMapping *mapping)

{
  ON__CNewMeshFace *pOVar1;
  TYPE TVar2;
  undefined1 auVar3 [8];
  int iVar4;
  uint uVar5;
  ulong uVar6;
  double *pdVar7;
  double *pdVar8;
  long lVar9;
  int *piVar10;
  void *pvVar11;
  uint uVar12;
  ulong uVar13;
  float *pfVar14;
  int iVar15;
  size_t size;
  ulong uVar16;
  ON_MeshFace *pOVar17;
  ON_Xform *pOVar18;
  ON_3fPoint *pOVar19;
  int *piVar20;
  uint uVar21;
  ON_Xform *pOVar22;
  uint uVar23;
  ulong uVar24;
  undefined4 uVar25;
  long lVar26;
  long lVar27;
  int *piVar28;
  long lVar29;
  int iVar30;
  ON_3fVector *pOVar31;
  bool bVar32;
  byte bVar33;
  float fVar34;
  float fVar35;
  double dVar36;
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar42 [4];
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  double dVar48;
  double dVar49;
  ON_3dPoint rst;
  ON_SimpleArray<ON__CMeshFaceTC> ftc_list;
  ON_Workspace ws;
  ON__CMeshFaceTC ftc;
  int sd [4];
  ON_3dPoint P;
  ON_3dVector N;
  ON_SimpleArray<ON__CNewMeshFace> mflist;
  ON_3dVector n;
  ON__CChangeTextureCoordinateHelper helper;
  ON_MeshFace *local_2e0;
  ON_3dPoint local_2c8;
  double local_2b0;
  float *local_2a8;
  float *local_2a0;
  undefined1 local_298 [8];
  undefined1 auStack_290 [8];
  float local_288;
  ON_2fPoint OStack_284;
  ON_2fPoint OStack_27c;
  ON_2fPoint aOStack_274 [2];
  ON_3dPoint local_260;
  int *local_248;
  int local_23c;
  undefined1 local_238 [20];
  undefined1 auStack_224 [4];
  undefined8 uStack_220;
  double local_218 [13];
  long local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  int local_18c;
  int local_188 [6];
  ON_MeshFace *local_170;
  ulong local_168;
  double local_160;
  ON_3dPoint local_158;
  ON_3dVector local_140;
  double local_128;
  ON_Xform *local_120;
  ON_Xform *local_118;
  ON_Xform *local_110;
  ON_SimpleArray<ON__CNewMeshFace> local_108;
  ON_3dVector local_f0;
  double local_d8;
  undefined8 uStack_d0;
  ON_3dVector local_c8;
  ON_Xform local_b0;
  
  bVar33 = 0;
  uVar12 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  size = (size_t)(int)uVar12;
  if (((2 < (long)size) &&
      (uVar21 = (mesh->m_F).m_count, local_198 = (ulong)uVar21, 0 < (int)uVar21)) &&
     (uVar12 == (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count)) {
    TVar2 = mapping->m_type;
    bVar32 = Tsd == (int *)0x0;
    local_1b0 = (long)mesh_T_stride;
    local_2b0 = two_pi_tc;
    local_2a8 = mesh_T;
    local_248 = Tsd;
    if ((TVar2 != box_mapping || bVar32) || (mapping->m_texture_space != single)) {
      ON_Workspace::ON_Workspace((ON_Workspace *)&local_260);
      piVar10 = ON_Workspace::GetIntMemory((ON_Workspace *)&local_260,size);
      pvVar11 = ON_Workspace::GetMemory((ON_Workspace *)&local_260,size * 4);
      fVar35 = (float)(local_2b0 * 0.25);
      fVar34 = (float)(local_2b0 * 0.75);
      pfVar14 = local_2a8 + 1;
      uVar6 = 0;
      uVar21 = 0;
      iVar4 = 0;
      do {
        piVar10[uVar6] = 0;
        fVar38 = pfVar14[-1];
        *(float *)((long)pvVar11 + uVar6 * 4) = fVar38;
        if (bVar32 || TVar2 != cylinder_mapping) {
          if (TVar2 != box_mapping || bVar32) {
            if (TVar2 != sphere_mapping) goto LAB_004e5771;
            uVar23 = 8;
            if ((0.001 <= *pfVar14) && (*pfVar14 <= 0.999)) goto LAB_004e5771;
          }
          else {
            if ((local_248[uVar6] | 2U) != 3) goto LAB_004e5798;
LAB_004e5771:
            uVar23 = 1;
            if ((fVar35 <= fVar38) && (uVar23 = 4, fVar38 <= fVar34)) goto LAB_004e5798;
          }
          piVar10[uVar6] = uVar23;
          uVar21 = uVar21 | uVar23;
          iVar4 = iVar4 + 1;
        }
        else if (local_248[uVar6] == 1) goto LAB_004e5771;
LAB_004e5798:
        uVar6 = uVar6 + 1;
        pfVar14 = pfVar14 + local_1b0;
      } while (uVar12 != uVar6);
      if ((4 < uVar21) || ((0x13U >> uVar21 & 1) == 0)) {
        local_298 = (undefined1  [8])&PTR__ON_SimpleArray_00822858;
        auStack_290 = (undefined1  [8])0x0;
        local_288 = 0.0;
        OStack_284.x = 0.0;
        iVar4 = iVar4 * 4 + 0x80;
        if (iVar4 != 0) {
          ON_SimpleArray<ON__CMeshFaceTC>::SetCapacity
                    ((ON_SimpleArray<ON__CMeshFaceTC> *)local_298,(long)iVar4);
        }
        pOVar17 = (mesh->m_F).m_a;
        stack0xfffffffffffffdd8 = 0.0;
        uStack_220 = 0.0;
        local_238._0_8_ = 0.0;
        local_218[0] = 0.0;
        fVar38 = (float)local_2b0;
        uVar6 = local_198 & 0xffffffff;
        if ((int)local_198 < 2) {
          uVar6 = 1;
        }
        piVar28 = pOVar17->vi + 3;
        uVar24 = 0;
        do {
          uVar12 = piVar10[((ON_MeshFace *)(piVar28 + -3))->vi[0]];
          local_238._4_4_ = uVar12;
          local_238._8_4_ = piVar10[piVar28[-2]];
          uVar21 = piVar10[piVar28[-1]];
          local_238._12_4_ = uVar21;
          uVar23 = piVar10[*piVar28];
          stack0xfffffffffffffdd8 = (double)CONCAT44(auStack_224,uVar23);
          uVar5 = uVar21 | uVar23 | local_238._8_4_ | uVar12;
          if ((4 < uVar5) || ((0x13U >> (uVar5 & 0x1f) & 1) == 0)) {
            local_238._0_4_ = 0xffffffff;
            stack0xfffffffffffffdd8 =
                 (double)CONCAT44(*(undefined4 *)
                                   ((long)pvVar11 + (long)((ON_MeshFace *)(piVar28 + -3))->vi[0] * 4
                                   ),uVar23);
            fVar41 = *(float *)((long)pvVar11 + (long)piVar28[-2] * 4);
            fVar40 = *(float *)((long)pvVar11 + (long)piVar28[-1] * 4);
            uStack_220 = (double)CONCAT44(fVar40,fVar41);
            fVar39 = *(float *)((long)pvVar11 + (long)*piVar28 * 4);
            local_218[0] = (double)CONCAT44(local_218[0]._4_4_,fVar39);
            uVar25 = (undefined4)uVar24;
            if ((uVar5 & 8) != 0) {
              if (uVar12 == 8) {
                fVar47 = -1.234321e+38;
                if (uVar23 != 8) {
                  fVar47 = fVar39;
                }
                fVar39 = -1.234321e+38;
                if (local_238._8_4_ != 8) {
                  fVar39 = fVar41;
                }
                if ((((fVar47 != -1.234321e+38) || (NAN(fVar47))) || (fVar39 != -1.234321e+38)) ||
                   (NAN(fVar39))) {
                  if (((fVar47 != -1.234321e+38) || (fVar41 = fVar39, NAN(fVar47))) &&
                     ((fVar39 != -1.234321e+38 || (fVar41 = fVar47, NAN(fVar39))))) {
                    fVar41 = (fVar39 + fVar47) * 0.5;
                  }
                  local_238._4_4_ = (uint)(fVar34 < fVar41) << 2;
                  if (fVar41 < fVar35) {
                    local_238._4_4_ = 1;
                  }
                  stack0xfffffffffffffdd8 = (double)CONCAT44(fVar41,uVar23);
                  uVar5 = uVar5 | local_238._4_4_;
                  local_238._0_4_ = uVar25;
                }
              }
              if (local_238._8_4_ == 8) {
                auVar42 = (undefined1  [4])-1.234321e+38;
                if (local_238._4_4_ != 8) {
                  auVar42 = auStack_224;
                }
                fVar41 = -1.234321e+38;
                if (uVar21 != 8) {
                  fVar41 = fVar40;
                }
                if ((((float)auVar42 != -1.234321e+38) || (NAN((float)auVar42))) ||
                   ((fVar41 != -1.234321e+38 || (NAN(fVar41))))) {
                  if ((((float)auVar42 != -1.234321e+38) || (fVar39 = fVar41, NAN((float)auVar42)))
                     && ((fVar41 != -1.234321e+38 || (fVar39 = (float)auVar42, NAN(fVar41))))) {
                    fVar39 = (fVar41 + (float)auVar42) * 0.5;
                  }
                  local_238._8_4_ = (uint)(fVar34 < fVar39) << 2;
                  if (fVar39 < fVar35) {
                    local_238._8_4_ = 1;
                  }
                  uStack_220 = (double)CONCAT44(fVar40,fVar39);
                  uVar5 = uVar5 | local_238._8_4_;
                  local_238._0_4_ = uVar25;
                }
              }
              if (uVar21 == 8) {
                auVar44._0_12_ = ZEXT812(0xfeb9b851);
                auVar44._12_4_ = 0;
                if (local_238._8_4_ != 8) {
                  auVar44 = ZEXT416((uint)(float)uStack_220);
                }
                iVar4 = piVar28[-1];
                iVar30 = *piVar28;
                piVar20 = (int *)(local_238 + 0x10);
                if (iVar4 == iVar30) {
                  piVar20 = (int *)(local_238 + 4);
                }
                fVar41 = -1.234321e+38;
                if (*piVar20 != 8) {
                  pdVar7 = local_218;
                  if (iVar4 == iVar30) {
                    pdVar7 = (double *)(local_238 + 0x14);
                  }
                  fVar41 = *(float *)pdVar7;
                }
                fVar40 = auVar44._0_4_;
                if ((((fVar40 != -1.234321e+38) || (NAN(fVar40))) || (fVar41 != -1.234321e+38)) ||
                   (NAN(fVar41))) {
                  if ((fVar40 != -1.234321e+38) || (NAN(fVar40))) {
                    if ((fVar41 != -1.234321e+38) || (NAN(fVar41))) {
                      auVar44._0_4_ = (fVar40 + fVar41) * 0.5;
                    }
                    fVar41 = auVar44._0_4_;
                  }
                  local_238._12_4_ = (uint)(fVar34 < fVar41) << 2;
                  if (fVar41 < fVar35) {
                    local_238._12_4_ = 1;
                  }
                  uStack_220 = (double)CONCAT44(fVar41,(float)uStack_220);
                  if (iVar4 == iVar30) {
                    local_218[0] = (double)CONCAT44(local_218[0]._4_4_,fVar41);
                    stack0xfffffffffffffdd8 = (double)CONCAT44(auStack_224,local_238._12_4_);
                  }
                  uVar5 = uVar5 | local_238._12_4_;
                  local_238._0_4_ = uVar25;
                }
              }
              if ((local_238._16_4_ == 8) && (piVar28[-1] != *piVar28)) {
                auVar45._0_12_ = ZEXT812(0xfeb9b851);
                auVar45._12_4_ = 0;
                if (local_238._12_4_ != 8) {
                  auVar45 = ZEXT416((uint)uStack_220._4_4_);
                }
                auVar42 = (undefined1  [4])-1.234321e+38;
                if (local_238._4_4_ != 8) {
                  auVar42 = auStack_224;
                }
                fVar41 = auVar45._0_4_;
                if ((((fVar41 != -1.234321e+38) || (NAN(fVar41))) ||
                    ((float)auVar42 != -1.234321e+38)) || (NAN((float)auVar42))) {
                  if ((fVar41 != -1.234321e+38) || (NAN(fVar41))) {
                    if (((float)auVar42 != -1.234321e+38) || (NAN((float)auVar42))) {
                      auVar45._0_4_ = (fVar41 + (float)auVar42) * 0.5;
                    }
                    auVar42 = auVar45._0_4_;
                  }
                  uVar12 = (uint)(fVar34 < (float)auVar42) << 2;
                  if ((float)auVar42 < fVar35) {
                    uVar12 = 1;
                  }
                  local_218[0] = (double)CONCAT44(local_218[0]._4_4_,auVar42);
                  stack0xfffffffffffffdd8 = (double)CONCAT44(auStack_224,uVar12);
                  uVar5 = uVar5 | uVar12;
                  local_238._0_4_ = uVar25;
                }
              }
            }
            if ((~uVar5 & 5) == 0) {
              if ((local_2b0 != 1.0) || (NAN(local_2b0))) {
                if (local_238._4_4_ == 4) {
                  auVar37 = ZEXT816(0);
                  auVar46 = ZEXT416((uint)((fVar38 - (float)auStack_224) + 0.0));
                }
                else {
                  auVar37 = ZEXT816(0);
                  auVar46 = ZEXT816(0);
                  if (local_238._4_4_ == 1) {
                    auVar37 = ZEXT416((uint)((float)auStack_224 + 0.0));
                  }
                }
                if (local_238._8_4_ == 4) {
                  auVar46._0_4_ = auVar46._0_4_ + (fVar38 - (float)uStack_220);
                }
                else if (local_238._8_4_ == 1) {
                  auVar37._0_4_ = auVar37._0_4_ + (float)uStack_220;
                }
                if (local_238._12_4_ == 4) {
                  auVar46._0_4_ = auVar46._0_4_ + (fVar38 - uStack_220._4_4_);
                }
                else if (local_238._12_4_ == 1) {
                  auVar37._0_4_ = auVar37._0_4_ + uStack_220._4_4_;
                }
                if (piVar28[-1] != *piVar28) {
                  if (local_238._16_4_ == 4) {
                    auVar46._0_4_ = auVar46._0_4_ + (fVar38 - local_218[0]._0_4_);
                  }
                  else if (local_238._16_4_ == 1) {
                    auVar37._0_4_ = auVar37._0_4_ + local_218[0]._0_4_;
                  }
                }
                if (auVar46._0_4_ <= auVar37._0_4_) {
                  if (local_238._4_4_ == 4) {
                    stack0xfffffffffffffdd8 = (double)((ulong)stack0xfffffffffffffdd8 & 0xffffffff);
                    local_238._4_4_ = 4;
                    local_238._0_4_ = uVar25;
                  }
                  if (local_238._8_4_ == 4) {
                    uStack_220 = (double)((ulong)(uint)uStack_220._4_4_ << 0x20);
                    local_238._0_4_ = uVar25;
                  }
                  if (local_238._12_4_ == 4) {
                    uStack_220 = (double)((ulong)uStack_220 & 0xffffffff);
                    local_238._0_4_ = uVar25;
                  }
                  if (local_238._16_4_ == 4) {
                    local_218[0]._0_4_ = 0.0;
                    fVar41 = local_218[0]._0_4_;
                    goto LAB_004e5df7;
                  }
                }
                else {
                  if (local_238._4_4_ == 1) {
                    stack0xfffffffffffffdd8 = (double)CONCAT44(fVar38,local_238._16_4_);
                    local_238._4_4_ = 1;
                    local_238._0_4_ = uVar25;
                  }
                  if (local_238._8_4_ == 1) {
                    uStack_220 = (double)CONCAT44(uStack_220._4_4_,fVar38);
                    local_238._0_4_ = uVar25;
                  }
                  if (local_238._12_4_ == 1) {
                    uStack_220 = (double)CONCAT44(fVar38,(float)uStack_220);
                    local_238._0_4_ = uVar25;
                  }
                  fVar41 = fVar38;
                  if (local_238._16_4_ == 1) {
LAB_004e5df7:
                    local_218[0] = (double)CONCAT44(local_218[0]._4_4_,fVar41);
                    local_238._0_4_ = uVar25;
                  }
                }
              }
              else {
                if (local_238._4_4_ == 1) {
                  stack0xfffffffffffffdd8 =
                       (double)CONCAT44((float)auStack_224 + 1.0,local_238._16_4_);
                  local_238._4_4_ = 1;
                  local_238._0_4_ = uVar25;
                }
                if (local_238._8_4_ == 1) {
                  uStack_220 = (double)CONCAT44(uStack_220._4_4_,(float)uStack_220 + 1.0);
                  local_238._0_4_ = uVar25;
                }
                if (local_238._12_4_ == 1) {
                  uStack_220 = (double)CONCAT44(uStack_220._4_4_ + 1.0,(float)uStack_220);
                  local_238._0_4_ = uVar25;
                }
                if (local_238._16_4_ == 1) {
                  fVar41 = local_218[0]._0_4_ + 1.0;
                  goto LAB_004e5df7;
                }
              }
            }
            if (-1 < (int)local_238._0_4_) {
              ON_SimpleArray<ON__CMeshFaceTC>::Append
                        ((ON_SimpleArray<ON__CMeshFaceTC> *)local_298,(ON__CMeshFaceTC *)local_238);
            }
          }
          fVar41 = local_288;
          uVar24 = uVar24 + 1;
          piVar28 = piVar28 + 4;
        } while (uVar6 != uVar24);
        if (0 < (long)(int)local_288) {
          lVar29 = 0;
          iVar4 = 0;
          do {
            iVar30 = *(int *)((long)((long)auStack_290 + 4) + lVar29 + -4);
            fVar35 = *(float *)((long)((long)auStack_290 + 0x14) + lVar29);
            pfVar14 = (float *)((long)pvVar11 + (long)pOVar17[iVar30].vi[0] * 4);
            if ((fVar35 != *pfVar14) || (NAN(fVar35) || NAN(*pfVar14))) {
              ((bool *)((long)auStack_290 + 0x24))[lVar29] = true;
              iVar4 = iVar4 + 1;
            }
            fVar35 = *(float *)((long)((long)auStack_290 + 0x14) + lVar29 + 4);
            pfVar14 = (float *)((long)pvVar11 + (long)pOVar17[iVar30].vi[1] * 4);
            if ((fVar35 != *pfVar14) || (NAN(fVar35) || NAN(*pfVar14))) {
              ((bool *)((long)auStack_290 + 0x24))[lVar29 + 1] = true;
              iVar4 = iVar4 + 1;
            }
            fVar35 = *(float *)((long)((long)auStack_290 + 0x14) + lVar29 + 8);
            iVar15 = pOVar17[iVar30].vi[2];
            pfVar14 = (float *)((long)pvVar11 + (long)iVar15 * 4);
            if ((fVar35 != *pfVar14) || (NAN(fVar35) || NAN(*pfVar14))) {
              ((bool *)((long)auStack_290 + 0x24))[lVar29 + 2] = true;
              iVar4 = iVar4 + 1;
            }
            if (iVar15 != pOVar17[iVar30].vi[3]) {
              fVar35 = *(float *)((long)((long)auStack_290 + 0x14) + lVar29 + 0xc);
              pfVar14 = (float *)((long)pvVar11 + (long)pOVar17[iVar30].vi[3] * 4);
              if ((fVar35 != *pfVar14) || (NAN(fVar35) || NAN(*pfVar14))) {
                ((bool *)((long)auStack_290 + 0x24))[lVar29 + 3] = true;
                iVar4 = iVar4 + 1;
              }
            }
            lVar29 = lVar29 + 0x28;
          } while ((long)(int)local_288 * 0x28 != lVar29);
          if (0 < iVar4) {
            ON__CChangeTextureCoordinateHelper::ON__CChangeTextureCoordinateHelper
                      ((ON__CChangeTextureCoordinateHelper *)&local_b0,mesh,iVar4,&local_2a8);
            lVar29 = 0;
            do {
              auVar3 = auStack_290;
              pfVar14 = local_2a8;
              pOVar17 = (mesh->m_F).m_a + *(int *)((long)((long)auStack_290 + 4) + lVar29 + -4);
              if (((bool *)((long)auStack_290 + 0x24))[lVar29] == true) {
                fVar35 = *(float *)((long)((long)auStack_290 + 0x14) + lVar29);
                if ((local_2a8[pOVar17->vi[0] * mesh_T_stride] != fVar35) ||
                   (NAN(local_2a8[pOVar17->vi[0] * mesh_T_stride]) || NAN(fVar35))) {
                  iVar4 = ON__CChangeTextureCoordinateHelper::DupVertex
                                    ((ON__CChangeTextureCoordinateHelper *)&local_b0,pOVar17->vi[0])
                  ;
                  pfVar14[iVar4 * mesh_T_stride] = fVar35;
                  pOVar17->vi[0] = iVar4;
                }
              }
              pfVar14 = local_2a8;
              if (((bool *)((long)auVar3 + 0x24))[lVar29 + 1] == true) {
                fVar35 = *(float *)((long)((long)auVar3 + 0x14) + lVar29 + 4);
                if ((local_2a8[pOVar17->vi[1] * mesh_T_stride] != fVar35) ||
                   (NAN(local_2a8[pOVar17->vi[1] * mesh_T_stride]) || NAN(fVar35))) {
                  iVar4 = ON__CChangeTextureCoordinateHelper::DupVertex
                                    ((ON__CChangeTextureCoordinateHelper *)&local_b0,pOVar17->vi[1])
                  ;
                  pfVar14[iVar4 * mesh_T_stride] = fVar35;
                  pOVar17->vi[1] = iVar4;
                }
              }
              if (((bool *)((long)auVar3 + 0x24))[lVar29 + 2] == true) {
                ON__CChangeTextureCoordinateHelper::ChangeTextureCoordinate
                          ((ON__CChangeTextureCoordinateHelper *)&local_b0,pOVar17->vi,2,
                           *(float *)((long)((long)auVar3 + 0x14) + lVar29 + 8),-1.234321e+38,
                           local_2a8,mesh_T_stride);
              }
              pfVar14 = local_2a8;
              if (((bool *)((long)auVar3 + 0x24))[lVar29 + 3] == true) {
                fVar35 = *(float *)((long)((long)auVar3 + 0x14) + lVar29 + 0xc);
                if ((local_2a8[pOVar17->vi[3] * mesh_T_stride] != fVar35) ||
                   (NAN(local_2a8[pOVar17->vi[3] * mesh_T_stride]) || NAN(fVar35))) {
                  iVar4 = ON__CChangeTextureCoordinateHelper::DupVertex
                                    ((ON__CChangeTextureCoordinateHelper *)&local_b0,pOVar17->vi[3])
                  ;
                  pfVar14[iVar4 * mesh_T_stride] = fVar35;
                  pOVar17->vi[3] = iVar4;
                }
              }
              lVar29 = lVar29 + 0x28;
            } while ((ulong)(uint)fVar41 * 0x28 != lVar29);
            ON__CChangeTextureCoordinateHelper::~ON__CChangeTextureCoordinateHelper
                      ((ON__CChangeTextureCoordinateHelper *)&local_b0);
          }
        }
        ON_SimpleArray<ON__CMeshFaceTC>::~ON_SimpleArray
                  ((ON_SimpleArray<ON__CMeshFaceTC> *)local_298);
      }
      ON_Workspace::~ON_Workspace((ON_Workspace *)&local_260);
    }
    else {
      local_18c = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      if (((2 < local_18c) && (uVar12 = (mesh->m_F).m_count, uVar6 = (ulong)uVar12, 0 < (int)uVar12)
          ) && (local_18c == (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count)) {
        pOVar17 = (mesh->m_F).m_a;
        local_108._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00822818;
        local_108.m_a = (ON__CNewMeshFace *)0x0;
        local_108.m_count = 0;
        local_108.m_capacity = 0;
        local_2a0 = mesh_T;
        ON_SimpleArray<ON__CNewMeshFace>::SetCapacity(&local_108,0x200);
        local_110 = &mapping->m_Pxyz;
        local_118 = &mapping->m_Nxyz;
        local_120 = &mapping->m_uvw;
        uVar24 = 0;
        local_23c = 0;
        piVar10 = local_248;
        lVar29 = local_1b0;
        local_2e0 = pOVar17;
        local_170 = pOVar17;
        local_168 = uVar6;
        do {
          iVar4 = piVar10[pOVar17[uVar24].vi[0]];
          local_188[1] = piVar10[pOVar17[uVar24].vi[1]];
          iVar30 = pOVar17[uVar24].vi[2];
          local_188[2] = piVar10[iVar30];
          iVar15 = pOVar17[uVar24].vi[3];
          local_188[3] = piVar10[iVar15];
          local_188[0] = iVar4;
          if (((iVar4 != local_188[1]) || (iVar4 != local_188[2])) || (iVar4 != local_188[3])) {
            pOVar17 = pOVar17 + uVar24;
            OStack_27c.y = 0.0;
            aOStack_274[0].x = 0.0;
            aOStack_274[0].y = 0.0;
            local_288 = 0.0;
            OStack_284.x = 0.0;
            OStack_284.y = 0.0;
            OStack_27c.x = 0.0;
            local_298 = (undefined1  [8])0x0;
            auStack_290 = (undefined1  [8])0x0;
            local_1a8 = uVar24;
            ON_2fPoint::operator=
                      ((ON_2fPoint *)(auStack_290 + 4),local_2a0 + pOVar17->vi[0] * lVar29);
            ON_2fPoint::operator=(&OStack_284,local_2a0 + pOVar17->vi[1] * lVar29);
            ON_2fPoint::operator=(&OStack_27c,local_2a0 + pOVar17->vi[2] * lVar29);
            ON_2fPoint::operator=(aOStack_274,local_2a0 + pOVar17->vi[3] * lVar29);
            fVar35 = (float)(~-(uint)(0.5 < (float)auStack_290._4_4_) & auStack_290._4_4_ |
                            (uint)(1.0 - (float)auStack_290._4_4_) &
                            -(uint)(0.5 < (float)auStack_290._4_4_));
            fVar34 = 0.0;
            if (0.0 <= fVar35) {
              fVar34 = (float)(~-(uint)(0.5 < local_288) & (uint)local_288 |
                              (uint)(1.0 - local_288) & -(uint)(0.5 < local_288));
              if (fVar34 <= fVar35) {
                fVar35 = fVar34;
              }
              fVar34 = (float)(~-(uint)(fVar34 < 0.0) & (uint)fVar35);
            }
            uVar13 = (ulong)((iVar30 != iVar15) + 3);
            uVar6 = 1;
            do {
              fVar35 = *(float *)(auStack_290 + uVar6 * 8 + 4);
              fVar35 = (float)(~-(uint)(0.5 < fVar35) & (uint)fVar35 |
                              (uint)(1.0 - fVar35) & -(uint)(0.5 < fVar35));
              fVar38 = 0.0;
              if (0.0 <= fVar35) {
                fVar38 = (&local_288)[uVar6 * 2];
                fVar38 = (float)(~-(uint)(0.5 < fVar38) & (uint)fVar38 |
                                (uint)(1.0 - fVar38) & -(uint)(0.5 < fVar38));
                if (fVar38 <= fVar35) {
                  fVar35 = fVar38;
                }
                fVar38 = (float)(~-(uint)(fVar38 < 0.0) & (uint)fVar35);
              }
              if (fVar34 < fVar38) {
                iVar4 = local_188[uVar6];
                fVar34 = fVar38;
              }
              uVar6 = uVar6 + 1;
            } while (uVar13 != uVar6);
            uVar16 = 0;
            local_1a0 = uVar13;
            do {
              if (local_188[uVar16] == iVar4) goto LAB_004e549c;
              iVar30 = local_2e0->vi[uVar16];
              ON_3dVector::ON_3dVector(&local_140,0.0,0.0,0.0);
              pOVar19 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
              bVar32 = ON_Mesh::HasVertexNormals(mesh);
              pOVar31 = (ON_3fVector *)0x0;
              if (bVar32) {
                pOVar31 = (mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
              }
              pOVar18 = &ON_Xform::IdentityTransformation;
              pOVar22 = &local_b0;
              for (lVar29 = 0x10; lVar29 != 0; lVar29 = lVar29 + -1) {
                pOVar22->m_xform[0][0] = pOVar18->m_xform[0][0];
                pOVar18 = (ON_Xform *)((long)pOVar18 + ((ulong)bVar33 * -2 + 1) * 8);
                pOVar22 = (ON_Xform *)((long)pOVar22 + ((ulong)bVar33 * -2 + 1) * 8);
              }
              pOVar18 = &ON_Xform::IdentityTransformation;
              pdVar7 = (double *)local_238;
              for (lVar29 = 0x10; lVar29 != 0; lVar29 = lVar29 + -1) {
                *pdVar7 = pOVar18->m_xform[0][0];
                pOVar18 = (ON_Xform *)((long)pOVar18 + ((ulong)bVar33 * -2 + 1) * 8);
                pdVar7 = pdVar7 + (ulong)bVar33 * -2 + 1;
              }
              if (((mesh_xform == (ON_Xform *)0x0) ||
                  (bVar32 = ON_Xform::IsZero(mesh_xform), bVar32)) ||
                 (bVar32 = ON_Xform::IsIdentity(mesh_xform,0.0), bVar32)) {
LAB_004e4d51:
                pdVar7 = (double *)0x0;
                bVar32 = false;
              }
              else {
                dVar36 = ON_Xform::GetMappingXforms(mesh_xform,&local_b0,(ON_Xform *)local_238);
                if ((dVar36 == 0.0) && (!NAN(dVar36))) goto LAB_004e4d51;
                pdVar7 = ON_Xform::operator[](&local_b0,0);
                pdVar8 = ON_Xform::operator[]((ON_Xform *)local_238,0);
                bVar32 = pdVar8 != (double *)0x0;
              }
              if ((pOVar31 == (ON_3fVector *)0x0) || (mapping->m_projection != ray_projection)) {
                pOVar19 = pOVar19 + iVar30;
                if (pdVar7 == (double *)0x0) {
                  ON_3dPoint::operator=(&local_158,pOVar19);
                }
                else {
                  dVar36 = (double)pOVar19->x;
                  dVar43 = (double)pOVar19->y;
                  dVar48 = (double)pOVar19->z;
                  dVar49 = pdVar7[0xe] * dVar48 + pdVar7[0xc] * dVar36 + pdVar7[0xd] * dVar43 +
                           pdVar7[0xf];
                  uVar6 = -(ulong)(dVar49 != 0.0);
                  local_158.z = (double)(~uVar6 & 0x3ff0000000000000 | (ulong)(1.0 / dVar49) & uVar6
                                        );
                  local_158.x = (pdVar7[2] * dVar48 + *pdVar7 * dVar36 + pdVar7[1] * dVar43 +
                                pdVar7[3]) * local_158.z;
                  local_158.y = (pdVar7[6] * dVar48 + pdVar7[4] * dVar36 + pdVar7[5] * dVar43 +
                                pdVar7[7]) * local_158.z;
                  local_158.z = (dVar48 * pdVar7[10] + dVar36 * pdVar7[8] + dVar43 * pdVar7[9] +
                                pdVar7[0xb]) * local_158.z;
                }
              }
              else {
                pOVar19 = pOVar19 + iVar30;
                if (bVar32 && pdVar7 != (double *)0x0) {
                  dVar36 = (double)pOVar19->x;
                  dVar48 = (double)pOVar19->y;
                  dVar43 = (double)pOVar19->z;
                  dVar49 = pdVar7[0xe] * dVar43 + pdVar7[0xc] * dVar36 + pdVar7[0xd] * dVar48 +
                           pdVar7[0xf];
                  uVar6 = -(ulong)(dVar49 != 0.0);
                  local_158.z = (double)(~uVar6 & 0x3ff0000000000000 | (ulong)(1.0 / dVar49) & uVar6
                                        );
                  local_158.x = (pdVar7[2] * dVar43 + *pdVar7 * dVar36 + pdVar7[1] * dVar48 +
                                pdVar7[3]) * local_158.z;
                  local_158.y = (pdVar7[6] * dVar43 + pdVar7[4] * dVar36 + pdVar7[5] * dVar48 +
                                pdVar7[7]) * local_158.z;
                  local_158.z = (dVar43 * pdVar7[10] + dVar36 * pdVar7[8] + dVar48 * pdVar7[9] +
                                pdVar7[0xb]) * local_158.z;
                  dVar36 = (double)pOVar31[iVar30].x;
                  dVar43 = (double)pOVar31[iVar30].y;
                  dVar48 = (double)pOVar31[iVar30].z;
                  local_140.x = pdVar7[2] * dVar48 + *pdVar7 * dVar36 + pdVar7[1] * dVar43;
                  local_140.y = pdVar7[6] * dVar48 + pdVar7[4] * dVar36 + pdVar7[5] * dVar43;
                  local_140.z = pdVar7[10] * dVar48 + pdVar7[8] * dVar36 + pdVar7[9] * dVar43;
                  ON_3dVector::Unitize(&local_140);
                }
                else {
                  ON_3dPoint::operator=(&local_158,pOVar19);
                  ON_3dVector::operator=(&local_140,pOVar31 + iVar30);
                }
              }
              ON_Xform::operator*(&local_2c8,local_110,&local_158);
              ON_Xform::operator*(&local_f0,local_118,&local_140);
              ON_3dVector::Unitize(&local_f0);
              if (mapping->m_projection != ray_projection) goto LAB_004e52d2;
              bVar32 = true;
              iVar30 = 0;
              switch(iVar4) {
              case 1:
                uVar12 = 0xbff00000;
                break;
              case 2:
                uVar12 = 0x3ff00000;
                break;
              case 3:
                iVar15 = 1;
                goto LAB_004e510c;
              case 4:
                iVar15 = 1;
                goto LAB_004e5131;
              case 5:
                iVar15 = 2;
LAB_004e510c:
                bVar32 = false;
                uVar12 = 0xbff00000;
                goto LAB_004e513c;
              case 6:
                iVar15 = 2;
LAB_004e5131:
                bVar32 = false;
                uVar12 = 0x3ff00000;
                goto LAB_004e513c;
              default:
                goto switchD_004e50f4_default;
              }
              iVar15 = 0;
LAB_004e513c:
              dVar43 = (double)((ulong)uVar12 << 0x20) -
                       *(double *)((long)&local_2c8.x + (ulong)(uint)(iVar15 * 8));
              dVar36 = *(double *)((long)&local_f0.x + (ulong)(uint)(iVar15 * 8));
              if ((double)((ulong)dVar36 & (ulong)DAT_006a6010) * 1e+100 <=
                  (double)((ulong)dVar43 & (ulong)DAT_006a6010)) {
switchD_004e50f4_default:
                dVar36 = -1.23432101234321e+308;
              }
              else {
                local_160 = (double)((ulong)uVar12 << 0x20);
                local_d8 = dVar43 / dVar36;
                uStack_d0 = 0;
                operator*(&local_c8,local_d8,&local_f0);
                ON_3dPoint::operator+(&local_260,&local_2c8,&local_c8);
                if (!bVar32) {
                  local_128 = local_260.x;
                  pdVar7 = ON_3dPoint::operator[](&local_260,iVar15);
                  local_260.x = *pdVar7;
                  pdVar7 = ON_3dPoint::operator[](&local_260,iVar15);
                  *pdVar7 = local_128;
                }
                uVar6 = (ulong)DAT_006a6010;
                if ((1.490116119385e-08 < (double)((ulong)(local_260.x - local_160) & uVar6)) ||
                   (100000000.0 < (double)((ulong)local_260.y & uVar6)))
                goto switchD_004e50f4_default;
                dVar36 = -1.23432101234321e+308;
                if ((double)((ulong)local_260.z & uVar6) <= 100000000.0) {
                  iVar30 = iVar4;
                  dVar36 = local_d8;
                }
              }
              if (iVar30 == iVar4) {
                operator*(&local_c8,dVar36,&local_f0);
                ON_3dPoint::operator+(&local_260,&local_2c8,&local_c8);
                local_2c8.z = local_260.z;
                local_2c8.x = local_260.x;
                local_2c8.y = local_260.y;
              }
LAB_004e52d2:
              dVar43 = 5.0;
              dVar36 = local_2c8.y;
              switch(iVar4) {
              case 1:
                local_2c8.x = -local_2c8.y;
                local_2c8.y = local_2c8.z;
                dVar43 = 3.0;
                break;
              case 2:
                local_2c8.y = local_2c8.z;
                local_2c8.x = dVar36;
                dVar43 = 1.0;
                break;
              case 3:
                local_2c8.y = local_2c8.z;
                dVar43 = 0.0;
                break;
              case 4:
                local_2c8.y = local_2c8.z;
                local_2c8.x = -local_2c8.x;
                dVar43 = 2.0;
                break;
              case 5:
                local_2c8.x = -local_2c8.x;
                dVar43 = 4.0;
                break;
              case 6:
                break;
              default:
                bVar32 = false;
                goto LAB_004e5416;
              }
              dVar36 = local_2c8.x * 0.5 + 0.5;
              local_2c8.z = 0.0;
              if (mapping->m_texture_space == divided) {
                dVar48 = 6.0;
                if (mapping->m_bCapped == false) {
                  dVar48 = 4.0;
                }
                dVar36 = (dVar43 + dVar36) / dVar48;
              }
              local_2c8.y = local_2c8.y * 0.5 + 0.5;
              local_2c8.x = dVar36;
              bVar32 = true;
              ON_Xform::operator*(&local_260,local_120,&local_2c8);
LAB_004e5416:
              if ((bVar32 != false) && (bVar32 = ON_3dPoint::IsValid(&local_260), bVar32)) {
                local_198 = CONCAT44(local_198._4_4_,(float)local_260.x);
                local_2b0 = (double)CONCAT44(local_2b0._4_4_,(float)local_260.y);
              }
              uVar13 = local_1a0;
              if (bVar32 == false) goto LAB_004e54de;
              if (((float)local_198 != *(float *)(auStack_290 + uVar16 * 8 + 4)) ||
                 (NAN((float)local_198) || NAN(*(float *)(auStack_290 + uVar16 * 8 + 4)))) {
LAB_004e5481:
                *(float *)(auStack_290 + uVar16 * 8 + 4) = (float)local_198;
                (&local_288)[uVar16 * 2] = local_2b0._0_4_;
                auStack_290[uVar16] = 1;
                local_298._4_4_ = local_298._4_4_ + 1;
              }
              else if ((local_2b0._0_4_ != (&local_288)[uVar16 * 2]) ||
                      (NAN(local_2b0._0_4_) || NAN((&local_288)[uVar16 * 2]))) goto LAB_004e5481;
LAB_004e549c:
              uVar16 = uVar16 + 1;
            } while (uVar13 != uVar16);
            uVar16 = uVar13 & 0xffffffff;
LAB_004e54de:
            uVar25 = local_298._4_4_;
            pOVar17 = local_170;
            piVar10 = local_248;
            uVar24 = local_1a8;
            lVar29 = local_1b0;
            uVar6 = local_168;
            if (0 < (int)local_298._4_4_ && (uint)uVar13 <= (uint)uVar16) {
              local_298._0_4_ = (int)local_1a8;
              ON_SimpleArray<ON__CNewMeshFace>::Append(&local_108,(ON__CNewMeshFace *)local_298);
              local_23c = local_23c + uVar25;
              pOVar17 = local_170;
              piVar10 = local_248;
              uVar24 = local_1a8;
              lVar29 = local_1b0;
              uVar6 = local_168;
            }
          }
          uVar24 = uVar24 + 1;
          local_2e0 = local_2e0 + 1;
        } while (uVar24 != uVar6);
        if (0 < local_23c) {
          ON__CChangeTextureCoordinateHelper::ON__CChangeTextureCoordinateHelper
                    ((ON__CChangeTextureCoordinateHelper *)&local_b0,mesh,local_23c + local_18c,
                     &local_2a0);
          lVar29 = (long)local_108.m_count;
          if (0 < lVar29) {
            lVar27 = 0;
            do {
              pOVar1 = local_108.m_a + lVar27;
              local_298 = *(undefined1 (*) [8])pOVar1;
              auVar44 = *(undefined1 (*) [16])&local_108.m_a[lVar27].tc[0].y;
              auStack_290[0] = pOVar1->bNewV[0];
              auStack_290[1] = pOVar1->bNewV[1];
              auStack_290[2] = pOVar1->bNewV[2];
              auStack_290[3] = pOVar1->bNewV[3];
              auStack_290._4_4_ = pOVar1->tc[0].x;
              OStack_27c.y = local_108.m_a[lVar27].tc[2].y;
              aOStack_274[0] = (local_108.m_a[lVar27].tc + 2)[1];
              local_288 = auVar44._0_4_;
              OStack_284.x = auVar44._4_4_;
              OStack_284.y = auVar44._8_4_;
              OStack_27c.x = auVar44._12_4_;
              lVar9 = (long)(int)local_298._0_4_;
              pOVar17 = (mesh->m_F).m_a;
              iVar30 = pOVar17[lVar9].vi[2];
              iVar4 = pOVar17[lVar9].vi[3];
              lVar26 = 0;
              do {
                if (auStack_290[lVar26] == '\x01') {
                  ON__CChangeTextureCoordinateHelper::ChangeTextureCoordinate
                            ((ON__CChangeTextureCoordinateHelper *)&local_b0,pOVar17[lVar9].vi,
                             (int)lVar26,*(float *)(auStack_290 + lVar26 * 8 + 4),
                             (&local_288)[lVar26 * 2],local_2a0,mesh_T_stride);
                }
                lVar26 = lVar26 + 1;
              } while ((ulong)(iVar30 != iVar4) + 3 != lVar26);
              lVar27 = lVar27 + 1;
            } while (lVar27 != lVar29);
          }
          ON__CChangeTextureCoordinateHelper::~ON__CChangeTextureCoordinateHelper
                    ((ON__CChangeTextureCoordinateHelper *)&local_b0);
        }
        ON_SimpleArray<ON__CNewMeshFace>::~ON_SimpleArray(&local_108);
      }
    }
  }
  return;
}

Assistant:

static
void AdjustMeshPeriodicTextureCoordinatesHelper(
          ON_Mesh& mesh,
          const ON_Xform* mesh_xform,
          float* mesh_T,
          int    mesh_T_stride,
          const int* Tsd,
          double two_pi_tc,
          const ON_TextureMapping& mapping
          )
{
  // This helper adjusts texture coordinates on faces that
  // span the seam on mapping spheres and cylinders and
  // resolves the multiple valued problem that
  // exists at the poles of sphere mappings.

  const int vcnt = mesh.m_V.Count();
  const int fcnt = mesh.m_F.Count();
  if ( vcnt < 3 || fcnt < 1 || vcnt != mesh.m_T.Count() )
    return;

  // see if any texture coordinate adjustment is necessary
  const ON_TextureMapping::TYPE mapping_type = mapping.m_type;
  const bool bSphereCheck = ( ON_TextureMapping::TYPE::sphere_mapping == mapping_type );
  const bool bCylinderCheck = (Tsd && ON_TextureMapping::TYPE::cylinder_mapping == mapping_type);
  const bool bBoxCheck = (Tsd && ON_TextureMapping::TYPE::box_mapping == mapping_type);

  if ( bBoxCheck && ON_TextureMapping::TEXTURE_SPACE::single == mapping.m_texture_space )
  {
    AdjustSingleBoxTextureCoordinatesHelper( mesh, mesh_xform, mesh_T, mesh_T_stride, Tsd, mapping );
    return;
  }

  ON_Workspace ws;
  int* quad = ws.GetIntMemory(vcnt); // ~ws will free quad memory
  float* Tx = (float*)ws.GetMemory(vcnt*sizeof(Tx[0]));
  float t;
  int vi, ti, q=0;
  int ftc_count = 0;

  const float ang0 = (float)(0.25*two_pi_tc);
  const float ang1 = (float)(0.75*two_pi_tc);


  for ( vi = ti = 0; vi < vcnt; vi++, ti += mesh_T_stride )
  {
    quad[vi] = 0;
    Tx[vi] = mesh_T[ti];
    if ( bCylinderCheck )
    {
      if ( 1 != Tsd[vi] )
        continue;
    }
    else if ( bBoxCheck )
    {
      if ( 1 != Tsd[vi] && 3 != Tsd[vi] )
        continue;
    }
    else if ( bSphereCheck )
    {
      t = mesh_T[ti+1]; // t = "v" texture coordinate
      if ( t < 0.001f )
      {
        quad[vi] = 8; q |= 8; // south pole point
        ftc_count++;
        continue;
      }
      if ( t > 0.999f )
      {
        quad[vi] = 8; q |= 8; // north pole point
        ftc_count++;
        continue;
      }
    }

    t = Tx[vi]; // t = "u" texture coordinate
    if ( t < ang0 )
    {
      quad[vi] = 1; q |= 1; // longitude < pi/2
      ftc_count++;
    }
    else if ( t > ang1 )
    {
      quad[vi] = 4; q |= 4; // longitude > 3pi/2
      ftc_count++;
    }
  }

  if ( 0 == q || 1 == q || 4 == q )
  {
    // nothing needs to be adjusted
    return;
  }

  // 4*ftc_count = (over) estimate of the number of faces that
  // will be changed.
  ON_SimpleArray<ON__CMeshFaceTC> ftc_list(ftc_count*4 + 128);
  ftc_count = 0;
  const ON_MeshFace* F = mesh.m_F.Array();
  const int* Fvi;
  int fi;
  ON__CMeshFaceTC ftc;
  memset(&ftc,0,sizeof(ftc));
  float t0, t1;

  for ( fi = 0; fi < fcnt; fi++ )
  {
    Fvi = F[fi].vi;

    ftc.quad[0] = quad[Fvi[0]];
    ftc.quad[1] = quad[Fvi[1]];
    ftc.quad[2] = quad[Fvi[2]];
    ftc.quad[3] = quad[Fvi[3]];

    q = (ftc.quad[0] | ftc.quad[1] | ftc.quad[2] | ftc.quad[3]);
    if ( 0 == q || 1 == q || 4 == q )
    {
      // no adjustments need to be made
      continue;
    }

    // ftc.fi will be set to fi if a texture coordinate needs to be adjusted
    ftc.fi = -1;

    ftc.Tx[0] = Tx[Fvi[0]];
    ftc.Tx[1] = Tx[Fvi[1]];
    ftc.Tx[2] = Tx[Fvi[2]];
    ftc.Tx[3] = Tx[Fvi[3]];

    if ( 0 != (8&q) )
    {
      // see if check for north/south sphere mapping poles and fix them
      if ( 8 == ftc.quad[0] )
      {
        t0 = (8 == ftc.quad[3]) ? ON_UNSET_FLOAT : ftc.Tx[3];
        t1 = (8 == ftc.quad[1]) ? ON_UNSET_FLOAT : ftc.Tx[1];
        if ( ON_UNSET_FLOAT != t0 || ON_UNSET_FLOAT != t1 )
        {
          ftc.Tx[0] = PoleFix(t0,t1);
          ftc.quad[0] = ((ftc.Tx[0] < ang0) ? 1 : ((ftc.Tx[0] > ang1) ? 4 : 0));
          q |= ftc.quad[0];
          ftc.fi = fi;
        }
      }
      if ( 8 == ftc.quad[1] )
      {
        t0 = (8 == ftc.quad[0]) ? ON_UNSET_FLOAT : ftc.Tx[0];
        t1 = (8 == ftc.quad[2]) ? ON_UNSET_FLOAT : ftc.Tx[2];
        if ( ON_UNSET_FLOAT != t0 || ON_UNSET_FLOAT != t1 )
        {
          ftc.Tx[1] = PoleFix(t0,t1);
          ftc.quad[1] = ((ftc.Tx[1] < ang0) ? 1 : ((ftc.Tx[1] > ang1) ? 4 : 0));
          q |= ftc.quad[1];
          ftc.fi = fi;
        }
      }
      if ( 8 == ftc.quad[2] )
      {
        int k = (Fvi[2] == Fvi[3]) ? 0 : 3;
        t0 = (8 == ftc.quad[1]) ? ON_UNSET_FLOAT : ftc.Tx[1];
        t1 = (8 == ftc.quad[k]) ? ON_UNSET_FLOAT : ftc.Tx[k];
        if ( ON_UNSET_FLOAT != t0 || ON_UNSET_FLOAT != t1 )
        {
          ftc.Tx[2] = PoleFix(t0,t1);
          ftc.quad[2] = ((ftc.Tx[2] < ang0) ? 1 : ((ftc.Tx[2] > ang1) ? 4 : 0));
          if ( !k )
          {
            ftc.Tx[3] = ftc.Tx[2];
            ftc.quad[3] = ftc.quad[2];
          }
          q |= ftc.quad[2];
          ftc.fi = fi;
        }
      }
      if ( 8 == ftc.quad[3] && Fvi[2] != Fvi[3] )
      {
        t0 = (8 == ftc.quad[2]) ? ON_UNSET_FLOAT : ftc.Tx[2];
        t1 = (8 == ftc.quad[0]) ? ON_UNSET_FLOAT : ftc.Tx[0];
        if ( ON_UNSET_FLOAT != t0 || ON_UNSET_FLOAT != t1 )
        {
          ftc.Tx[3] = PoleFix(t0,t1);
          ftc.quad[3] = ((ftc.Tx[3] < ang0) ? 1 : ((ftc.Tx[3] > ang1) ? 4 : 0));
          q |= ftc.quad[3];
          ftc.fi = fi;
        }
      }
    }

    if ( 5 == (5&q) )
    {
      // The face has corners on both sides of the seam
      if ( two_pi_tc == 1.0 )
      {
        if ( 1 == ftc.quad[0] ) {ftc.Tx[0] += 1.0f; ftc.fi = fi;}
        if ( 1 == ftc.quad[1] ) {ftc.Tx[1] += 1.0f; ftc.fi = fi;}
        if ( 1 == ftc.quad[2] ) {ftc.Tx[2] += 1.0f; ftc.fi = fi;}
        if ( 1 == ftc.quad[3] ) {ftc.Tx[3] += 1.0f; ftc.fi = fi;}
      }
      else
      {
        // With divided textures, wrapping the texture coordinate
        // does not work because it wraps into a region of the
        // texture not use by this "side".  In this case, the
        // only thing to do is to pick the best end of the texture
        // map and clamp the tcs that hang over.  If the mesh
        // has edges near the texture seam, the picture will
        // still look ok.
        float f0=0.0f, f1=0.0f, twopitc = (float)two_pi_tc;
        //int f0cnt=0, f1cnt=0;
        if ( 1 == ftc.quad[0] ) f0 += ftc.Tx[0]; else if ( 4 == ftc.quad[0] ) f1 += twopitc-ftc.Tx[0];
        if ( 1 == ftc.quad[1] ) f0 += ftc.Tx[1]; else if ( 4 == ftc.quad[1] ) f1 += twopitc-ftc.Tx[1];
        if ( 1 == ftc.quad[2] ) f0 += ftc.Tx[2]; else if ( 4 == ftc.quad[2] ) f1 += twopitc-ftc.Tx[2];
        if (Fvi[2] != Fvi[3])
        {
          if ( 1 == ftc.quad[3] ) f0 += ftc.Tx[3]; else if ( 4 == ftc.quad[3] ) f1 += twopitc-ftc.Tx[3];
        }
        if (f0 >= f1 )
        {
          // "most" of the face is on the left side of the texture
          // If a vertex is on the right side, clamp its tc to 0.
          if ( 4 == ftc.quad[0] ) {ftc.Tx[0] = 0.0f; ftc.fi = fi;}
          if ( 4 == ftc.quad[1] ) {ftc.Tx[1] = 0.0f; ftc.fi = fi;}
          if ( 4 == ftc.quad[2] ) {ftc.Tx[2] = 0.0f; ftc.fi = fi;}
          if ( 4 == ftc.quad[3] ) {ftc.Tx[3] = 0.0f; ftc.fi = fi;}
        }
        else
        {
          // "most" of the face is on the right side of the texture
          // If a vertex is on the left side, clamp its tc to two_pi_tc.
          if ( 1 == ftc.quad[0] ) {ftc.Tx[0] = twopitc; ftc.fi = fi;}
          if ( 1 == ftc.quad[1] ) {ftc.Tx[1] = twopitc; ftc.fi = fi;}
          if ( 1 == ftc.quad[2] ) {ftc.Tx[2] = twopitc; ftc.fi = fi;}
          if ( 1 == ftc.quad[3] ) {ftc.Tx[3] = twopitc; ftc.fi = fi;}
        }
      }
    }

    if ( ftc.fi >= 0 )
    {
      // face will require special handling
      ftc_list.Append(ftc);
    }
  }

  ftc_count = ftc_list.Count();
  if ( ftc_count <= 0 )
    return;

  // Count the number of new vertices that will be added.
  int ftci;
  int newvcnt = 0;
  for ( ftci = 0; ftci < ftc_count; ftci++ )
  {
    ON__CMeshFaceTC& ftc_local = ftc_list[ftci];
    Fvi = F[ftc_local.fi].vi;
    if ( ftc_local.Tx[0] != Tx[Fvi[0]] )
    {
      ftc_local.bSetT[0] = true;
      newvcnt++;
    }
    if ( ftc_local.Tx[1] != Tx[Fvi[1]] )
    {
      ftc_local.bSetT[1] = true;
      newvcnt++;
    }
    if ( ftc_local.Tx[2] != Tx[Fvi[2]] )
    {
      ftc_local.bSetT[2] = true;
      newvcnt++;
    }
    if ( Fvi[2] != Fvi[3] )
    {
      if ( ftc_local.Tx[3] != Tx[Fvi[3]] )
      {
        ftc_local.bSetT[3] = true;
        newvcnt++;
      }
    }
  }

  if ( newvcnt <= 0 )
    return;


  F = 0; // Setting them to nullptr makes sure anybody who
         // tries to use them below will crash.

  // reserve room for new vertex information
  ON__CChangeTextureCoordinateHelper helper(mesh,newvcnt,mesh_T);

  // add vertices and update mesh faces
  for ( ftci = 0; ftci < ftc_count; ftci++ )
  {
    const ON__CMeshFaceTC& ftc_local = ftc_list[ftci];
    int* meshFvi = mesh.m_F[ftc_local.fi].vi;

    if ( ftc_local.bSetT[0] )
    {
      helper.ChangeTextureCoordinate(meshFvi,0,ftc_local.Tx[0],ON_UNSET_FLOAT,mesh_T,mesh_T_stride);
    }
    if ( ftc_local.bSetT[1] )
    {
      helper.ChangeTextureCoordinate(meshFvi,1,ftc_local.Tx[1],ON_UNSET_FLOAT,mesh_T,mesh_T_stride);
    }
    if ( ftc_local.bSetT[2] )
    {
      helper.ChangeTextureCoordinate(meshFvi,2,ftc_local.Tx[2],ON_UNSET_FLOAT,mesh_T,mesh_T_stride);
    }
    if ( ftc_local.bSetT[3] )
    {
      helper.ChangeTextureCoordinate(meshFvi,3,ftc_local.Tx[3],ON_UNSET_FLOAT,mesh_T,mesh_T_stride);
    }
  }
}